

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void P_CheckWeaponSwitch(player_t *player)

{
  player_t *player_local;
  
  if (player != (player_t *)0x0) {
    if (((player->WeaponState & 0x10) != 0) || (player->morphTics != 0)) {
      player->PendingWeapon = (AWeapon *)0xffffffffffffffff;
    }
    if (((player->PendingWeapon != (AWeapon *)0xffffffffffffffff) || (player->health < 1)) &&
       ((player->WeaponState & 8) != 0)) {
      P_DropWeapon(player);
    }
  }
  return;
}

Assistant:

void P_CheckWeaponSwitch (player_t *player)
{
	if (player == NULL)
	{
		return;
	}
	if ((player->WeaponState & WF_DISABLESWITCH) || // Weapon changing has been disabled.
		player->morphTics != 0)					// Morphed classes cannot change weapons.
	{ // ...so throw away any pending weapon requests.
		player->PendingWeapon = WP_NOCHANGE;
	}

	// Put the weapon away if the player has a pending weapon or has died, and
	// we're at a place in the state sequence where dropping the weapon is okay.
	if ((player->PendingWeapon != WP_NOCHANGE || player->health <= 0) &&
		player->WeaponState & WF_WEAPONSWITCHOK)
	{
		P_DropWeapon(player);
	}
}